

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapTest.cpp
# Opt level: O2

void print<std::map<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>>>
               (map<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>_> *t,
               char *s)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 3;
  poVar1 = std::operator<<((ostream *)&std::cout,s);
  std::operator<<(poVar1," contains:");
  for (p_Var2 = (t->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(t->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&std::cout," (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,p_Var2[1]._M_color);
    poVar1 = std::operator<<(poVar1," => ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&p_Var2[1].field_0x4);
    std::operator<<(poVar1,')');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void	print(T const & t, char const * s)
{
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << " (" << it->first << " => " << it->second << ')';
	std::cout << std::endl;
}